

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O1

Parsekey __thiscall
free_format_parser::HMpsFF::parseQuadRows
          (HMpsFF *this,HighsLogOptions *log_options,istream *file,Parsekey keyword)

{
  bool bVar1;
  Parsekey PVar2;
  Parsekey PVar3;
  int iVar4;
  int iVar5;
  HighsInt HVar6;
  iterator iVar7;
  long lVar8;
  size_t start;
  pointer pdVar9;
  HighsInt id;
  char *pcVar10;
  int iVar11;
  HMpsFF *this_00;
  HMpsFF *pHVar12;
  double dVar13;
  bool is_nan;
  bool skip;
  bool skip_1;
  size_t begin;
  size_t end;
  string row_name;
  string col_name;
  string coeff_name;
  string section_name;
  string strline;
  string rowname;
  bool local_152;
  bool local_151;
  pointer local_150;
  pointer local_148;
  Parsekey local_140;
  HighsInt local_13c;
  HMpsFF *local_138;
  HMpsFF *local_130;
  undefined1 local_128 [12];
  HighsInt local_11c;
  char local_118 [16];
  size_t local_108;
  Parsekey local_fc;
  undefined1 local_f8 [8];
  char *local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  HMpsFF *local_d8;
  string local_d0;
  string local_b0;
  pointer local_90;
  pointer local_88;
  undefined1 local_80 [16];
  string local_70;
  string local_50;
  
  local_90 = (pointer)local_80;
  local_88 = (pointer)0x0;
  local_80[0] = 0;
  pcVar10 = "QSECTION";
  if (keyword == kQcmatrix) {
    pcVar10 = "QCMATRIX";
  }
  local_138 = (HMpsFF *)log_options;
  local_fc = keyword;
  std::__cxx11::string::_M_replace((ulong)&local_90,0,(char *)0x0,(ulong)pcVar10);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  local_d0._M_string_length = 0;
  local_d0.field_2._M_local_buf[0] = '\0';
  local_f8 = (undefined1  [8])&local_e8;
  local_f0 = (char *)0x0;
  local_e8._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_130 = this;
  first_word(&local_50,&this->section_args,0);
  pHVar12 = local_130;
  if ((pointer)local_50._M_string_length == (pointer)0x0) {
    highsLogUser((HighsLogOptions *)local_138,kError,"No row name given in argument of %s\n",
                 local_90);
    PVar3 = kFail;
    goto LAB_001fbf12;
  }
  this_00 = (HMpsFF *)&local_130->rowname2idx;
  iVar7 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this_00,&local_50);
  if (iVar7.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
      ._M_cur == (__node_type *)0x0) {
LAB_001fb9fa:
    pHVar12->warning_issued_ = true;
    this_00 = local_138;
    highsLogUser((HighsLogOptions *)local_138,kWarning,
                 "Row name \"%s\" in %s section is not defined: ignored\n",local_50._M_dataplus._M_p
                 ,local_90);
  }
  else {
    iVar11 = *(int *)((long)iVar7.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                            ._M_cur + 0x28);
    if ((long)iVar11 != -2) {
      if (-1 < iVar11) {
        this_00 = (HMpsFF *)&pHVar12->qrows_entries;
        std::
        vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
        ::resize((vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                  *)this_00,(long)pHVar12->num_row);
      }
      local_d8 = (HMpsFF *)
                 ((pHVar12->qrows_entries).
                  super__Vector_base<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + iVar11);
      if (iVar11 == -1) {
        local_d8 = (HMpsFF *)&pHVar12->q_entries;
      }
      do {
        do {
          bVar1 = getMpsLine(this_00,file,&local_70,&local_151);
          if (!bVar1) goto LAB_001fbef0;
        } while (local_151 != false);
        if ((0.0 < pHVar12->time_limit_) &&
           (lVar8 = std::chrono::_V2::system_clock::now(),
           dVar13 = (double)lVar8 / 1000000000.0 - pHVar12->start_time,
           pHVar12->time_limit_ <= dVar13 && dVar13 != pHVar12->time_limit_)) goto LAB_001fbf9b;
        local_140 = (Parsekey)this;
        local_108 = 0;
        local_150 = (pointer)0x0;
        PVar3 = checkFirstWord(pHVar12,&local_70,&local_108,(size_t *)&local_150,&local_d0);
        if (PVar3 == kNone) {
          local_13c = getColIdx(pHVar12,&local_d0,true);
          iVar11 = 1;
          local_148 = local_150;
          while( true ) {
            std::__cxx11::string::_M_replace((ulong)local_f8,0,local_f0,0x3d2f67);
            first_word((string *)local_128,&local_70,(size_t)local_148);
            std::__cxx11::string::operator=((string *)local_f8,(string *)local_128);
            if ((char *)local_128._0_8_ != local_118) {
              operator_delete((void *)local_128._0_8_);
            }
            start = first_word_end(&local_70,(size_t)local_148);
            this_00 = (HMpsFF *)local_f8;
            iVar4 = std::__cxx11::string::compare((char *)this_00);
            iVar5 = 6;
            if (iVar4 == 0) break;
            id = 0x3d2f67;
            std::__cxx11::string::_M_replace
                      ((ulong)&local_b0,0,(char *)local_b0._M_string_length,0x3d2f67);
            first_word((string *)local_128,&local_70,start);
            std::__cxx11::string::operator=((string *)&local_b0,(string *)local_128);
            if ((char *)local_128._0_8_ != local_118) {
              operator_delete((void *)local_128._0_8_);
            }
            pdVar9 = (pointer)first_word_end(&local_70,start);
            iVar5 = std::__cxx11::string::compare((char *)&local_b0);
            if (iVar5 == 0) {
              local_150 = local_148;
              trim((string *)local_f8,&default_non_chars_abi_cxx11_);
              trim(&local_d0,&default_non_chars_abi_cxx11_);
              this_00 = local_138;
              highsLogUser((HighsLogOptions *)local_138,kError,
                           "%s has no coefficient for entry \"%s\" in column \"%s\"\n",local_90,
                           local_f8,local_d0._M_dataplus._M_p);
              local_140 = kFail;
              iVar5 = 1;
              goto LAB_001fbec9;
            }
            this_00 = local_130;
            HVar6 = getColIdx(local_130,(string *)local_f8,true);
            local_152 = false;
            pcVar10 = (char *)getValue(this_00,&local_b0,&local_152,id);
            if (local_152 == true) {
              bVar1 = false;
              this_00 = local_138;
              highsLogUser((HighsLogOptions *)local_138,kError,
                           "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",local_f8
                           ,local_d0._M_dataplus._M_p);
              local_140 = kFail;
              iVar5 = 1;
            }
            else {
              if (((double)pcVar10 != 0.0) || (NAN((double)pcVar10))) {
                if (local_fc == kQcmatrix) {
                  if (local_13c <= HVar6) {
                    local_128._8_4_ = local_13c;
                    this_00 = local_d8;
                    local_128._0_8_ = pcVar10;
                    local_11c = HVar6;
                    std::
                    vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>::
                    emplace_back<std::tuple<int,int,double>>
                              ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                                *)local_d8,(tuple<int,_int,_double> *)local_128);
                  }
                }
                else {
                  local_128._8_4_ = local_13c;
                  this_00 = local_d8;
                  local_128._0_8_ = pcVar10;
                  local_11c = HVar6;
                  std::vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                  ::emplace_back<std::tuple<int,int,double>>
                            ((vector<std::tuple<int,int,double>,std::allocator<std::tuple<int,int,double>>>
                              *)local_d8,(tuple<int,_int,_double> *)local_128);
                }
              }
              bVar1 = pdVar9 != (pointer)local_70._M_string_length;
              iVar5 = 6;
              local_148 = pdVar9;
              if (bVar1) {
                iVar5 = 0;
              }
            }
            if ((!bVar1) || (iVar11 = iVar11 + -1, iVar5 = 6, iVar11 != 0)) break;
          }
          local_150 = local_148;
LAB_001fbec9:
          bVar1 = iVar5 == 0 || iVar5 == 6;
          pHVar12 = local_130;
        }
        else {
          bVar1 = false;
          this_00 = local_138;
          highsLogDev((HighsLogOptions *)local_138,kInfo,"readMPS: Read %s  OK\n",local_90);
          local_140 = PVar3;
        }
        this = (HMpsFF *)(ulong)local_140;
        PVar3 = local_140;
      } while (bVar1);
      goto LAB_001fbf12;
    }
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
        ._M_cur == (__node_type *)0x0) goto LAB_001fb9fa;
  }
  do {
    do {
      bVar1 = getMpsLine(this_00,file,&local_70,(bool *)&local_150);
      pHVar12 = local_130;
      if (!bVar1) goto LAB_001fbef0;
    } while ((char)local_150 != '\0');
    this = (HMpsFF *)((ulong)this & 0xffffffff);
    if ((0.0 < local_130->time_limit_) &&
       (lVar8 = std::chrono::_V2::system_clock::now(),
       dVar13 = (double)lVar8 / 1000000000.0 - pHVar12->start_time,
       pHVar12->time_limit_ <= dVar13 && dVar13 != pHVar12->time_limit_)) goto LAB_001fbf9b;
    local_128._0_8_ = (char *)0x0;
    local_108 = 0;
    PVar2 = checkFirstWord(pHVar12,&local_70,(size_t *)local_128,&local_108,&local_d0);
    if (PVar2 != kNone) {
      pHVar12 = local_138;
      highsLogDev((HighsLogOptions *)local_138,kInfo,"readMPS: Read %s  OK\n",local_90);
      this = (HMpsFF *)(ulong)PVar2;
    }
    PVar3 = (Parsekey)this;
    this_00 = pHVar12;
  } while (PVar2 == kNone);
LAB_001fbf12:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  if (local_f8 != (undefined1  [8])&local_e8) {
    operator_delete((void *)local_f8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if (local_90 != (pointer)local_80) {
    operator_delete(local_90);
  }
  return PVar3;
LAB_001fbef0:
  PVar3 = kFail;
  goto LAB_001fbf12;
LAB_001fbf9b:
  PVar3 = kTimeout;
  goto LAB_001fbf12;
}

Assistant:

typename HMpsFF::Parsekey HMpsFF::parseQuadRows(
    const HighsLogOptions& log_options, std::istream& file,
    const HMpsFF::Parsekey keyword) {
  // Parse Hessian information from QSECTION or QCMATRIX
  // section according to keyword
  const bool qcmatrix = keyword == HMpsFF::Parsekey::kQcmatrix;
  std::string section_name;
  if (qcmatrix) {
    section_name = "QCMATRIX";
  } else {
    section_name = "QSECTION";
  }
  std::string strline;
  std::string col_name;
  std::string row_name;
  std::string coeff_name;
  size_t end_row_name;
  size_t end_coeff_name;
  HighsInt rowidx;            // index of quadratic row
  HighsInt qcolidx, qrowidx;  // indices in quadratic coefs matrix

  // Get row name from section argument
  std::string rowname = first_word(section_args, 0);
  if (rowname.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "No row name given in argument of %s\n", section_name.c_str());
    return HMpsFF::Parsekey::kFail;
  }

  auto mit = rowname2idx.find(rowname);
  // if row of section does not exist or is free (index -2), then skip
  if (mit == rowname2idx.end() || mit->second == -2) {
    if (mit == rowname2idx.end()) {
      warning_issued_ = true;
      highsLogUser(log_options, HighsLogType::kWarning,
                   "Row name \"%s\" in %s section is not defined: ignored\n",
                   rowname.c_str(), section_name.c_str());
    }
    // read lines until start of new section
    bool skip;
    while (getMpsLine(file, strline, skip)) {
      if (skip) continue;
      if (timeout()) return HMpsFF::Parsekey::kTimeout;

      size_t begin = 0;
      size_t end = 0;
      HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

      // start of new section?
      if (key != Parsekey::kNone) {
        highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                    section_name.c_str());
        return key;
      }
    }
    return Parsekey::kFail;  // unexpected end of file
  }
  rowidx = mit->second;
  assert(rowidx >= -1);
  assert(rowidx < num_row);

  if (rowidx >= 0) qrows_entries.resize(num_row);
  assert(rowidx == -1 || qrows_entries.size() == static_cast<size_t>(num_row));

  auto& qentries = (rowidx == -1 ? q_entries : qrows_entries[rowidx]);

  bool skip;
  while (getMpsLine(file, strline, skip)) {
    if (skip) continue;
    if (timeout()) return HMpsFF::Parsekey::kTimeout;

    size_t begin = 0;
    size_t end = 0;
    HMpsFF::Parsekey key = checkFirstWord(strline, begin, end, col_name);

    // start of new section?
    if (key != Parsekey::kNone) {
      highsLogDev(log_options, HighsLogType::kInfo, "readMPS: Read %s  OK\n",
                  section_name.c_str());
      return key;
    }

    // Get the column index
    qcolidx = getColIdx(col_name);
    assert(qcolidx >= 0 && qcolidx < num_col);

    // Loop over the maximum of two entries per row of the file
    for (int entry = 0; entry < 2; entry++) {
      // Get the row name
      row_name = "";
      row_name = first_word(strline, end);
      end_row_name = first_word_end(strline, end);

      if (row_name == "") break;

      coeff_name = "";
      coeff_name = first_word(strline, end_row_name);
      end_coeff_name = first_word_end(strline, end_row_name);

      if (coeff_name == "") {
        trim(row_name);
        trim(col_name);
        highsLogUser(
            log_options, HighsLogType::kError,
            "%s has no coefficient for entry \"%s\" in column \"%s\"\n",
            section_name.c_str(), row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }

      qrowidx = getColIdx(row_name);
      assert(qrowidx >= 0 && qrowidx < num_col);

      bool is_nan = false;
      double coeff = getValue(coeff_name, is_nan);  // atof(word.c_str());
      if (is_nan) {
        highsLogUser(
            log_options, HighsLogType::kError,
            "Hessian coefficient for entry \"%s\" in column \"%s\" is NaN\n",
            row_name.c_str(), col_name.c_str());
        return HMpsFF::Parsekey::kFail;
      }
      if (coeff) {
        if (qcmatrix) {
          // QCMATRIX has the whole Hessian, so store the entry if the
          // entry is in the lower triangle
          if (qrowidx >= qcolidx)
            qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        } else {
          // QSECTION has the lower triangle of the Hessian
          qentries.push_back(std::make_tuple(qrowidx, qcolidx, coeff));
        }
      }
      end = end_coeff_name;
      // Don't read more if end of line reached
      if (end == strline.length()) break;
    }
  }

  return HMpsFF::Parsekey::kFail;
}